

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *out,QRegularExpression *re)

{
  QDataStream *this;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QRegularExpression::pattern((QString *)&QStack_38,re);
  this = operator<<(out,(QString *)&QStack_38);
  QDataStream::operator<<
            (this,(((re->d).d.ptr)->patternOptions).
                  super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
                  super_QFlagsStorage<QRegularExpression::PatternOption>.i);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return out;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QRegularExpression &re)
{
    out << re.pattern() << quint32(re.patternOptions().toInt());
    return out;
}